

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O0

void pnga_access_idx(Integer g_a,Integer *lo,Integer *hi,AccessIndex *index,Integer *ld)

{
  short sVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  logical lVar7;
  size_t sVar8;
  long lVar9;
  Integer IVar10;
  long *in_RCX;
  char *pcVar11;
  ulong uVar12;
  undefined8 *in_RDX;
  long lVar13;
  undefined8 *in_RSI;
  long in_RDI;
  long *in_R8;
  char err_string_1 [256];
  Integer _d_4;
  int _ndim_4;
  int _i_4;
  int _itmp_1;
  int _offset_1;
  int _ndim_3;
  int _i_3;
  int _index_3 [7];
  int _ndim_2;
  int _i_2;
  int _itmp;
  int _ndim_1;
  int _i_1;
  int _index_2 [7];
  int _ndim;
  int _i;
  Integer _dimpos_1;
  Integer _dimstart_1;
  Integer _dim_1;
  Integer _index_1;
  Integer _d_3;
  Integer _nb_1;
  Integer _loc_1;
  Integer _dimpos;
  Integer _dimstart;
  Integer _dim;
  Integer _index;
  Integer _d_2;
  Integer _nb;
  Integer _loc;
  Integer _p_handle;
  Integer _pinv;
  Integer _hi [7];
  Integer _lo [7];
  Integer _last;
  Integer _factor;
  Integer _w;
  Integer _d_1;
  Integer _offset;
  char err_string [256];
  char *str;
  int _l;
  int _d;
  unsigned_long lptr;
  unsigned_long lref;
  unsigned_long elemsize;
  Integer p_handle;
  Integer i;
  Integer ow;
  Integer handle;
  char *ptr;
  char local_418 [256];
  ulong local_318;
  int local_310;
  int local_30c;
  int local_308;
  int local_304;
  int local_300;
  int local_2fc;
  int local_2f8 [7];
  int local_2dc;
  int local_2d8;
  int local_2d4;
  int local_2d0;
  int local_2cc;
  int local_2c8 [10];
  int local_2a0;
  int local_29c;
  char *in_stack_fffffffffffffd68;
  char *in_stack_fffffffffffffd70;
  long local_280;
  long local_278;
  long local_270;
  long local_258;
  long local_248;
  long local_240;
  long local_238;
  long local_220;
  long local_218 [8];
  long local_1d8 [7];
  long local_1a0;
  long local_198;
  long local_190;
  long local_188;
  long local_180;
  char local_178 [112];
  Integer *in_stack_fffffffffffffef8;
  Integer *in_stack_ffffffffffffff00;
  Integer in_stack_ffffffffffffff08;
  int local_70;
  int local_6c;
  DoubleComplex *local_60;
  long local_48;
  long local_40;
  
  lVar5 = in_RDI + 1000;
  local_60 = (DoubleComplex *)0x0;
  lVar6 = (long)GA[lVar5].p_handle;
  lVar7 = pnga_locate(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8)
  ;
  if (lVar7 == 0) {
    pnga_error(in_stack_fffffffffffffd70,(Integer)in_stack_fffffffffffffd68);
  }
  if (lVar6 != -1) {
    local_40 = (long)PGRP_LIST[lVar6].inv_map_proc_list[local_40];
  }
  iVar3 = armci_domain_id(0,(int)local_40);
  iVar4 = armci_domain_my_id(0);
  if ((iVar3 != iVar4) && (local_40 != GAme)) {
    pnga_error(in_stack_fffffffffffffd70,(Integer)in_stack_fffffffffffffd68);
  }
  lVar7 = pnga_locate(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8)
  ;
  if (lVar7 == 0) {
    pnga_error(in_stack_fffffffffffffd70,(Integer)in_stack_fffffffffffffd68);
  }
  if (lVar6 != -1) {
    local_40 = (long)PGRP_LIST[lVar6].inv_map_proc_list[local_40];
  }
  iVar3 = armci_domain_id(0,(int)local_40);
  iVar4 = armci_domain_my_id(0);
  if ((iVar3 != iVar4) && (local_40 != GAme)) {
    pnga_error(in_stack_fffffffffffffd70,(Integer)in_stack_fffffffffffffd68);
  }
  for (local_48 = 0; local_48 < GA[lVar5].ndim; local_48 = local_48 + 1) {
    if ((long)in_RDX[local_48] < (long)in_RSI[local_48]) {
      sprintf(local_178,"%s","cannot locate region: ");
      sVar8 = strlen("cannot locate region: ");
      sprintf(local_178 + (int)sVar8,"%s",GA[in_RDI + 1000].name);
      sVar8 = strlen(local_178);
      sprintf(local_178 + (int)sVar8," [%ld:%ld ",*in_RSI,*in_RDX);
      sVar8 = strlen(local_178);
      local_70 = (int)sVar8;
      for (local_6c = 1; local_6c < GA[lVar5].ndim; local_6c = local_6c + 1) {
        sprintf(local_178 + local_70,",%ld:%ld ",in_RSI[local_6c],in_RDX[local_6c]);
        sVar8 = strlen(local_178);
        local_70 = (int)sVar8;
      }
      sprintf(local_178 + local_70,"%s","]");
      strlen(local_178);
      pnga_error(in_stack_fffffffffffffd70,(Integer)in_stack_fffffffffffffd68);
    }
  }
  if (lVar6 != -1) {
    local_40 = (long)PGRP_LIST[lVar6].map_proc_list[local_40];
  }
  local_180 = 0;
  local_198 = 1;
  local_1a0 = (long)(GA[lVar5].ndim + -1);
  if (GA[lVar5].distr_type == 0) {
    if (GA[lVar5].num_rstrctd == 0) {
      lVar6 = (long)GA[lVar5].ndim;
      local_258 = 0;
      local_238 = 1;
      for (local_240 = 0; local_240 < lVar6; local_240 = local_240 + 1) {
        local_238 = GA[lVar5].nblock[local_240] * local_238;
      }
      if ((local_238 + -1 < local_40) || (local_40 < 0)) {
        for (local_240 = 0; local_240 < lVar6; local_240 = local_240 + 1) {
          local_1d8[local_240] = 0;
          local_218[local_240] = -1;
        }
      }
      else {
        local_248 = local_40;
        for (local_240 = 0; local_240 < lVar6; local_240 = local_240 + 1) {
          lVar13 = local_248 % (long)GA[lVar5].nblock[local_240];
          local_248 = local_248 / (long)GA[lVar5].nblock[local_240];
          lVar9 = lVar13 + local_258;
          local_258 = GA[lVar5].nblock[local_240] + local_258;
          local_1d8[local_240] = GA[lVar5].mapc[lVar9];
          if (lVar13 == GA[lVar5].nblock[local_240] + -1) {
            local_218[local_240] = GA[lVar5].dims[local_240];
          }
          else {
            local_218[local_240] = GA[lVar5].mapc[lVar9 + 1] + -1;
          }
        }
      }
    }
    else if (local_40 < GA[lVar5].num_rstrctd) {
      lVar6 = (long)GA[lVar5].ndim;
      in_stack_fffffffffffffd70 = (char *)0x0;
      local_270 = 1;
      for (local_278 = 0; local_278 < lVar6; local_278 = local_278 + 1) {
        local_270 = GA[lVar5].nblock[local_278] * local_270;
      }
      if ((local_270 + -1 < local_40) || (local_40 < 0)) {
        for (local_278 = 0; local_278 < lVar6; local_278 = local_278 + 1) {
          local_1d8[local_278] = 0;
          local_218[local_278] = -1;
        }
      }
      else {
        local_280 = local_40;
        for (local_278 = 0; local_278 < lVar6; local_278 = local_278 + 1) {
          lVar9 = local_280 % (long)GA[lVar5].nblock[local_278];
          local_280 = local_280 / (long)GA[lVar5].nblock[local_278];
          in_stack_fffffffffffffd68 = in_stack_fffffffffffffd70 + lVar9;
          in_stack_fffffffffffffd70 = in_stack_fffffffffffffd70 + GA[lVar5].nblock[local_278];
          local_1d8[local_278] = GA[lVar5].mapc[(long)in_stack_fffffffffffffd68];
          if (lVar9 == GA[lVar5].nblock[local_278] + -1) {
            local_218[local_278] = GA[lVar5].dims[local_278];
          }
          else {
            local_218[local_278] = GA[lVar5].mapc[(long)(in_stack_fffffffffffffd68 + 1)] + -1;
          }
        }
      }
    }
    else {
      sVar1 = GA[lVar5].ndim;
      local_2a0 = (int)sVar1;
      for (local_29c = 0; local_29c < sVar1; local_29c = local_29c + 1) {
        local_1d8[local_29c] = 0;
        local_218[local_29c] = -1;
      }
    }
  }
  else {
    iVar3 = (int)local_40;
    if (((GA[lVar5].distr_type == 1) || (GA[lVar5].distr_type == 2)) || (GA[lVar5].distr_type == 3))
    {
      sVar1 = GA[lVar5].ndim;
      local_2d0 = (int)sVar1;
      sVar2 = GA[lVar5].ndim;
      local_2dc = (int)sVar2;
      local_2d4 = iVar3;
      local_2c8[0] = (int)((long)iVar3 % GA[lVar5].num_blocks[0]);
      for (local_2d8 = 1; local_2d8 < sVar2; local_2d8 = local_2d8 + 1) {
        local_2d4 = (int)((long)(local_2d4 - local_2c8[local_2d8 + -1]) /
                         GA[lVar5].num_blocks[local_2d8 + -1]);
        local_2c8[local_2d8] = (int)((long)local_2d4 % GA[lVar5].num_blocks[local_2d8]);
      }
      for (local_2cc = 0; local_2cc < sVar1; local_2cc = local_2cc + 1) {
        local_1d8[local_2cc] = (long)local_2c8[local_2cc] * GA[lVar5].block_dims[local_2cc] + 1;
        local_218[local_2cc] = (long)(local_2c8[local_2cc] + 1) * GA[lVar5].block_dims[local_2cc];
        if (GA[lVar5].dims[local_2cc] < local_218[local_2cc]) {
          local_218[local_2cc] = GA[lVar5].dims[local_2cc];
        }
      }
    }
    else if (GA[lVar5].distr_type == 4) {
      local_300 = (int)GA[lVar5].ndim;
      local_304 = 0;
      local_310 = (int)GA[lVar5].ndim;
      local_2f8[0] = (int)((long)iVar3 % GA[lVar5].num_blocks[0]);
      local_308 = iVar3;
      for (local_30c = 1; local_30c < local_310; local_30c = local_30c + 1) {
        local_308 = (int)((long)(local_308 - local_2f8[local_30c + -1]) /
                         GA[lVar5].num_blocks[local_30c + -1]);
        local_2f8[local_30c] = (int)((long)local_308 % GA[lVar5].num_blocks[local_30c]);
      }
      for (local_2fc = 0; local_2fc < local_300; local_2fc = local_2fc + 1) {
        local_1d8[local_2fc] = GA[lVar5].mapc[local_304 + local_2f8[local_2fc]];
        if ((long)local_2f8[local_2fc] < GA[lVar5].num_blocks[local_2fc] + -1) {
          local_218[local_2fc] = GA[lVar5].mapc[local_304 + local_2f8[local_2fc] + 1] + -1;
        }
        else {
          local_218[local_2fc] = GA[lVar5].dims[local_2fc];
        }
        local_304 = local_304 + (int)GA[lVar5].num_blocks[local_2fc];
      }
    }
  }
  for (local_318 = 0; (long)local_318 < (long)GA[lVar5].ndim; local_318 = local_318 + 1) {
    if (((long)in_RSI[local_318] < local_1d8[local_318]) ||
       (local_218[local_318] < (long)in_RSI[local_318])) {
      sprintf(local_418,"check subscript failed:%ld not in (%ld:%ld) dim=%d",in_RSI[local_318],
              local_1d8[local_318],local_218[local_318],local_318 & 0xffffffff);
      pnga_error(in_stack_fffffffffffffd70,(Integer)in_stack_fffffffffffffd68);
    }
  }
  if (local_1a0 == 0) {
    *in_R8 = (local_218[0] - local_1d8[0]) + 1 + GA[lVar5].width[0] * 2;
  }
  for (local_188 = 0; local_188 < local_1a0; local_188 = local_188 + 1) {
    local_190 = GA[lVar5].width[local_188];
    local_180 = ((in_RSI[local_188] - local_1d8[local_188]) + local_190) * local_198 + local_180;
    in_R8[local_188] = (local_218[local_188] - local_1d8[local_188]) + 1 + local_190 * 2;
    local_198 = in_R8[local_188] * local_198;
  }
  local_180 = ((in_RSI[local_1a0] - local_1d8[local_1a0]) + GA[lVar5].width[local_1a0]) * local_198
              + local_180;
  if (GA[lVar5].p_handle == 0) {
    local_220 = (long)PGRP_LIST->inv_map_proc_list[local_40];
  }
  else if (GA[lVar5].num_rstrctd == 0) {
    local_220 = local_40;
  }
  else {
    local_220 = GA[lVar5].rstrctd_list[local_40];
  }
  pcVar11 = GA[lVar5].ptr[local_220] + local_180 * GA[lVar5].elemsize;
  uVar12 = (ulong)GA[lVar5].elemsize;
  IVar10 = pnga_type_c2f((long)GA[lVar5].type);
  switch(IVar10) {
  case 0x3f2:
    *in_RCX = (long)pcVar11 - (long)INT_MB >> 3;
    local_60 = (DoubleComplex *)INT_MB;
    break;
  case 0x3f4:
    *in_RCX = (long)pcVar11 - (long)FLT_MB >> 2;
    local_60 = (DoubleComplex *)FLT_MB;
    break;
  case 0x3f5:
    *in_RCX = (long)pcVar11 - (long)DBL_MB >> 3;
    local_60 = (DoubleComplex *)DBL_MB;
    break;
  case 0x3f6:
    *in_RCX = (long)pcVar11 - (long)SCPL_MB >> 3;
    local_60 = (DoubleComplex *)SCPL_MB;
    break;
  case 0x3f7:
    *in_RCX = (long)pcVar11 - (long)DCPL_MB >> 4;
    local_60 = DCPL_MB;
  }
  if ((ulong)pcVar11 % uVar12 != (ulong)local_60 % uVar12) {
    printf("%d: lptr=%lu(%lu) lref=%lu(%lu)\n",GAme & 0xffffffff,pcVar11,(ulong)pcVar11 % uVar12,
           local_60,(ulong)local_60 % uVar12);
    pnga_error(in_stack_fffffffffffffd70,(Integer)in_stack_fffffffffffffd68);
  }
  *in_RCX = *in_RCX + 1;
  return;
}

Assistant:

void pnga_access_idx(Integer g_a, Integer lo[], Integer hi[],
                     AccessIndex* index, Integer ld[])
{
char     *ptr;
Integer  handle = GA_OFFSET + g_a;
Integer  ow,i,p_handle;
unsigned long    elemsize;
unsigned long    lref=0, lptr;

   
   p_handle = GA[handle].p_handle;
   if(!pnga_locate(g_a,lo,&ow))pnga_error("locate top failed",0);
   if (p_handle != -1)
      ow = PGRP_LIST[p_handle].inv_map_proc_list[ow];
   if ((armci_domain_id(ARMCI_DOMAIN_SMP, ow) != armci_domain_my_id(ARMCI_DOMAIN_SMP)) && (ow != GAme)) 
      pnga_error("cannot access top of the patch",ow);
   if(!pnga_locate(g_a,hi, &ow))pnga_error("locate bottom failed",0);
   if (p_handle != -1)
      ow = PGRP_LIST[p_handle].inv_map_proc_list[ow];
   if ((armci_domain_id(ARMCI_DOMAIN_SMP, ow) != armci_domain_my_id(ARMCI_DOMAIN_SMP)) && (ow != GAme)) 
      pnga_error("cannot access bottom of the patch",ow);

   for (i=0; i<GA[handle].ndim; i++)
       if(lo[i]>hi[i]) {
           ga_RegionError(GA[handle].ndim, lo, hi, g_a);
       }

   
   if (p_handle != -1)
      ow = PGRP_LIST[p_handle].map_proc_list[ow];

   gam_Location(ow,handle, lo, &ptr, ld);

   /*
    * return patch address as the distance elements from the reference address
    *
    * .in Fortran we need only the index to the type array: dbl_mb or int_mb
    *  that are elements of COMMON in the the mafdecls.h include file
    * .in C we need both the index and the pointer
    */

   elemsize = (unsigned long)GA[handle].elemsize;

   /* compute index and check if it is correct */
   switch (pnga_type_c2f(GA[handle].type)){
     case MT_F_DBL:
        *index = (AccessIndex) ((DoublePrecision*)ptr - DBL_MB);
        lref = (unsigned long)DBL_MB;
        break;

     case MT_F_DCPL:
        *index = (AccessIndex) ((DoubleComplex*)ptr - DCPL_MB);
        lref = (unsigned long)DCPL_MB;
        break;

     case MT_F_SCPL:
        *index = (AccessIndex) ((SingleComplex*)ptr - SCPL_MB);
        lref = (unsigned long)SCPL_MB;
        break;

     case MT_F_INT:
        *index = (AccessIndex) ((Integer*)ptr - INT_MB);
        lref = (unsigned long)INT_MB;
        break;

     case MT_F_REAL:
        *index = (AccessIndex) ((float*)ptr - FLT_MB);
        lref = (unsigned long)FLT_MB;
        break;        
   }

   /* check the allignment */
   lptr = (unsigned long)ptr;
   if( lptr%elemsize != lref%elemsize ){ 
       printf("%d: lptr=%lu(%lu) lref=%lu(%lu)\n",(int)GAme,lptr,lptr%elemsize,
                                                    lref,lref%elemsize);
       pnga_error("nga_access: MA addressing problem: base address misallignment",
                 handle);
   }

   /* adjust index for Fortran addressing */
   (*index) ++ ;
   FLUSH_CACHE;

}